

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::iterate
          (BasicVariousTessLevelsPosAttrCase *this)

{
  TessPrimitiveType TVar1;
  SpacingMode mode;
  RenderContext *pRVar2;
  code *pcVar3;
  Archive *archive;
  pointer pcVar4;
  TextureFormat TVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 uVar10;
  deUint32 err;
  undefined4 extraout_var;
  long lVar11;
  ulong uVar12;
  TextureFormat *pTVar13;
  TextureFormat TVar14;
  float *inner;
  ChannelType CVar15;
  long lVar16;
  float *outer;
  undefined8 in_R9;
  void *data;
  int i;
  long lVar17;
  long lVar18;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  TextureLevel reference;
  RandomViewport viewport;
  float innerLevels [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  float outerLevels [4];
  Surface rendered;
  VertexArrayBinding attrBindings [1];
  TextureFormat local_2d8;
  TextureFormat TStack_2d0;
  long local_2c8;
  TextureFormat TStack_2c0;
  undefined1 local_2b0 [8];
  char *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  int local_288;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  RandomViewport local_258;
  undefined8 local_248;
  ChannelType local_240;
  float local_23c;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  float local_218 [6];
  TextureFormat local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  Surface local_1d8;
  RenderContext *local_1c0;
  undefined1 local_1b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  VertexArrayPointer local_188 [2];
  ios_base local_148 [8];
  ios_base local_140 [272];
  undefined4 extraout_var_00;
  
  local_200 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_258,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x100,0x100,dVar8);
  dVar8 = (((this->m_program).m_ptr)->m_program).m_program;
  local_1c0 = pRVar2;
  iVar7 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar11 = CONCAT44(extraout_var_00,iVar7);
  TVar1 = this->m_primitiveType;
  if (TVar1 == TESSPRIMITIVETYPE_TRIANGLES) {
    CVar15 = UNORM_INT8;
  }
  else if (TVar1 == TESSPRIMITIVETYPE_QUADS) {
    CVar15 = UNORM_INT16;
  }
  else {
    CVar15 = (uint)(TVar1 == TESSPRIMITIVETYPE_ISOLINES) * 5 - SNORM_INT16;
  }
  (**(code **)(lVar11 + 0x1a00))(local_258.x,local_258.y,local_258.width,local_258.height);
  (**(code **)(lVar11 + 0x1c0))();
  (**(code **)(lVar11 + 0x1680))(dVar8);
  local_240 = CVar15;
  (**(code **)(lVar11 + 0xfd8))(0x8e72,CVar15);
  lVar16 = 0x94f718;
  lVar18 = 0;
  do {
    mode = this->m_spacing;
    local_23c = iterate::tessLevelCases[lVar18].inner[1];
    iVar7 = getClampedRoundedTessLevel(mode,iterate::tessLevelCases[lVar18].inner[0]);
    iVar9 = getClampedRoundedTessLevel(mode,local_23c);
    local_248 = CONCAT44((float)iVar9,(float)iVar7);
    lVar17 = 0;
    do {
      iVar7 = getClampedRoundedTessLevel(mode,*(float *)(lVar16 + lVar17 * 4));
      iVar9 = (int)in_R9;
      local_218[lVar17] = (float)iVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    local_1b8._0_4_ = local_200.order;
    local_1b8._4_4_ = local_200.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 8),"Tessellation levels: ",0x15);
    uVar12 = (ulong)this->m_primitiveType;
    inner = (float *)0xffffffff;
    outer = (float *)0xffffffff;
    if (uVar12 < 3) {
      inner = (float *)(ulong)*(uint *)(&DAT_0093f41c + uVar12 * 4);
      outer = (float *)(ulong)*(uint *)(&DAT_0094ff30 + uVar12 * 4);
    }
    (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)local_2b0,(_anonymous_namespace_ *)&local_248,inner,(int)local_218,outer,
               iVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 8),(char *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_),
               (long)local_2a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_) != &local_2a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_),
                      local_2a0._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_140);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelInner0");
    (*pcVar3)(uVar10);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelInner1");
    (*pcVar3)(uVar10);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelOuter0");
    (*pcVar3)(uVar10);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelOuter1");
    (*pcVar3)(uVar10);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelOuter2");
    (*pcVar3)(uVar10);
    pcVar3 = *(code **)(lVar11 + 0x14e0);
    uVar10 = (**(code **)(lVar11 + 0xb48))(dVar8,"u_tessLevelOuter3");
    (*pcVar3)(uVar10);
    (**(code **)(lVar11 + 0x188))(0x4000);
    local_2d8.order = R;
    local_2d8.type = SNORM_INT8;
    TStack_2d0.order = R;
    TStack_2d0.type = SNORM_INT8;
    local_2c8 = 0;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_2d8,
               4);
    if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
      local_1b8._0_4_ = 0xbf4ccccd;
      local_1b8._4_4_ = 0xbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_4_ = 0x3f4ccccd;
      local_1b8._4_4_ = 0xbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_4_ = 0xbf4ccccd;
      local_1b8._4_4_ = 0x3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_4_ = 0x3f4ccccd;
      local_1b8._4_4_ = 0x3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
    }
    else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      local_1b8._0_4_ = 0x3f4ccccd;
      local_1b8._4_4_ = 0x3f19999a;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_4_ = R;
      local_1b8._4_4_ = 0xbf49374c;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_4_ = 0xbf4ccccd;
      local_1b8._4_4_ = 0x3f19999a;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
    }
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"in_v_position","");
    TVar5 = TStack_2d0;
    TVar14 = local_2d8;
    local_2b0._0_4_ = 1.4013e-45;
    local_2a8 = (char *)((long)&local_2a0 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,local_280._0_8_,(pointer)(local_280._8_8_ + local_280._0_8_));
    local_288 = 0;
    local_1b8._0_4_ = local_2b0._0_4_;
    local_1b8._8_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1b8 + 8),local_2a8,local_2a8 + local_2a0._M_allocated_capacity);
    local_190 = local_288;
    local_188[0].componentType = VTX_COMP_FLOAT;
    local_188[0].convert = VTX_COMP_CONVERT_NONE;
    local_188[0].numComponents = 2;
    local_188[0].numElements = (int)((ulong)((long)TVar5 - (long)TVar14) >> 3);
    local_188[0].stride = 0;
    local_188[0].data = (void *)TVar14;
    if (local_2a8 != local_2a0._M_local_buf + 8) {
      operator_delete(local_2a8,local_2a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    local_2b0._0_4_ = PRIMITIVETYPE_PATCHES;
    local_2b0._4_4_ = local_240;
    local_2a8 = (char *)CONCAT44(local_2a8._4_4_,3);
    local_2a0._M_allocated_capacity = 0;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar8,1,
              (VertexArrayBinding *)local_1b8,(PrimitiveList *)local_2b0,(DrawUtilCallback *)0x0);
    err = (**(code **)(lVar11 + 0x800))();
    glu::checkError(err,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x98d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._8_8_ != &local_1a0) {
      operator_delete((void *)local_1b8._8_8_,local_1a0._M_allocated_capacity + 1);
    }
    if (local_2d8 != (TextureFormat)0x0) {
      operator_delete((void *)local_2d8,local_2c8 - (long)local_2d8);
    }
    getPixels(&local_1d8,local_1c0,local_258.x,local_258.y,local_258.width,local_258.height);
    archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
    pcVar4 = (this->m_referenceImagePathPrefix)._M_dataplus._M_p;
    local_238 = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,
               pcVar4 + (this->m_referenceImagePathPrefix)._M_string_length);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::ostream::operator<<((ostringstream *)local_1b8,(int)lVar18);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    uVar12 = 0xf;
    if (local_238 != local_228) {
      uVar12 = local_228[0];
    }
    if (uVar12 < (ulong)(local_1f0 + local_230)) {
      uVar12 = 0xf;
      if (local_1f8 != local_1e8) {
        uVar12 = local_1e8[0];
      }
      if (uVar12 < (ulong)(local_1f0 + local_230)) goto LAB_003cfc47;
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238);
    }
    else {
LAB_003cfc47:
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1f8);
    }
    local_2d8 = (TextureFormat)&local_2c8;
    TVar14 = (TextureFormat)(pTVar13 + 2);
    if (*pTVar13 == TVar14) {
      local_2c8 = *(long *)TVar14;
      TStack_2c0 = pTVar13[3];
    }
    else {
      local_2c8 = *(long *)TVar14;
      local_2d8 = *pTVar13;
    }
    TStack_2d0 = pTVar13[1];
    *pTVar13 = TVar14;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(undefined1 *)TVar14 = 0;
    pTVar13 = (TextureFormat *)std::__cxx11::string::append((char *)&local_2d8);
    local_280._0_8_ = &local_270;
    TVar14 = (TextureFormat)(pTVar13 + 2);
    if (*pTVar13 == TVar14) {
      local_270._M_allocated_capacity = *(undefined8 *)TVar14;
      local_270._8_8_ = pTVar13[3];
    }
    else {
      local_270._M_allocated_capacity = *(undefined8 *)TVar14;
      local_280._0_8_ = *pTVar13;
    }
    local_280._8_8_ = pTVar13[1];
    *pTVar13 = TVar14;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar13[2].order = R;
    getPNG((TextureLevel *)local_2b0,archive,(string *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    if (local_2d8 != (TextureFormat)&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8 + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b8,(TextureLevel *)local_2b0);
    local_2d8.order = RGBA;
    local_2d8.type = UNORM_INT8;
    data = (void *)local_1d8.m_pixels.m_cap;
    if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
      data = local_1d8.m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)local_280,&local_2d8,local_1d8.m_width,local_1d8.m_height,1
               ,data);
    in_R9 = 1;
    bVar6 = tcu::fuzzyCompare((TestLog *)local_200,"ImageComparison","Image Comparison",
                              (ConstPixelBufferAccess *)local_1b8,
                              (ConstPixelBufferAccess *)local_280,0.002,COMPARE_LOG_RESULT);
    if (!bVar6) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2b0);
      tcu::Surface::~Surface(&local_1d8);
      return STOP;
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2b0);
    tcu::Surface::~Surface(&local_1d8);
    lVar18 = lVar18 + 1;
    lVar16 = lVar16 + 0x18;
    if (lVar18 == 3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

BasicVariousTessLevelsPosAttrCase::IterateResult BasicVariousTessLevelsPosAttrCase::iterate (void)
{
	static const struct
	{
		float inner[2];
		float outer[4];
	} tessLevelCases[] =
	{
		{ { 9.0f,	9.0f	},	{ 9.0f,		9.0f,	9.0f,	9.0f	} },
		{ { 8.0f,	11.0f	},	{ 13.0f,	15.0f,	18.0f,	21.0f	} },
		{ { 17.0f,	14.0f	},	{ 3.0f,		6.0f,	9.0f,	12.0f	} }
	};

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32			programGL			= m_program->getProgram();
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				patchSize			= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES	? 3
												: m_primitiveType == TESSPRIMITIVETYPE_QUADS		? 4
												: m_primitiveType == TESSPRIMITIVETYPE_ISOLINES		? 4
												: -1;

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, patchSize);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < DE_LENGTH_OF_ARRAY(tessLevelCases); tessLevelCaseNdx++)
	{
		float innerLevels[2];
		float outerLevels[4];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(innerLevels); i++)
			innerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].inner[i]);

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(outerLevels); i++)
			outerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].outer[i]);

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(&innerLevels[0], &outerLevels[0], m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner0"), innerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner1"), innerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter0"), outerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter1"), outerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter2"), outerLevels[2]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter3"), outerLevels[3]);

		gl.clear(GL_COLOR_BUFFER_BIT);

		{
			vector<Vec2> positions;
			positions.reserve(4);

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			{
				positions.push_back(Vec2( 0.8f,    0.6f));
				positions.push_back(Vec2( 0.0f, -0.786f));
				positions.push_back(Vec2(-0.8f,    0.6f));
			}
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			{
				positions.push_back(Vec2(-0.8f, -0.8f));
				positions.push_back(Vec2( 0.8f, -0.8f));
				positions.push_back(Vec2(-0.8f,  0.8f));
				positions.push_back(Vec2( 0.8f,  0.8f));
			}
			else
				DE_ASSERT(false);

			DE_ASSERT((int)positions.size() == patchSize);

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("in_v_position", 2, (int)positions.size(), 0, &positions[0].x())
			};

			glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Patches(patchSize));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		}

		{
			const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePathPrefix + "_" + de::toString(tessLevelCaseNdx) + ".png");
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.002f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}